

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidCrop3(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *pAVar4;
  ArrayFeatureType_ShapeRange *pAVar5;
  SizeRange *pSVar6;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  ostream *poVar7;
  undefined1 local_d0 [8];
  Result res;
  CropLayerParams *params;
  NeuralNetworkLayer *cropLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape2;
  FeatureDescription *topIn2;
  SizeRange *widthRange;
  SizeRange *heightRange;
  SizeRange *chanShape;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(pAVar4);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,6);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,6);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(pAVar4);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,100);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,1000);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(pAVar4);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,5);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,0xf);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,0xea);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,0x14c);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input2");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,2);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,10);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,0xb);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_crop(this_00);
  CoreML::Specification::CropLayerParams::add_offset
            ((CropLayerParams *)res.m_message.field_2._8_8_,1);
  CoreML::Specification::CropLayerParams::add_offset
            ((CropLayerParams *)res.m_message.field_2._8_8_,2);
  CoreML::validate<(MLModelType)500>((Result *)local_d0,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_d0);
  if (m1._oneof_case_[0]._0_1_) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xeef);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"!((res).good())");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_d0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidCrop3() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *chanShape = shape->mutable_shaperange()->add_sizeranges();
    chanShape->set_lowerbound(6);
    chanShape->set_upperbound(6);
    auto *heightRange = shape->mutable_shaperange()->add_sizeranges();
    heightRange->set_lowerbound(100);
    heightRange->set_upperbound(1000);
    auto *widthRange = shape->mutable_shaperange()->add_sizeranges();
    widthRange->set_lowerbound(5);
    widthRange->set_upperbound(15);


    shape->add_shape(234);
    shape->add_shape(332);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);
    shape2->add_shape(10);
    shape2->add_shape(11);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);
    params->add_offset(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}